

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void __thiscall memory_tree_ns::memory_tree::memory_tree(memory_tree *this)

{
  long in_RDI;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  v_init<memory_tree_ns::node>();
  *(undefined8 *)(in_RDI + 8) = local_28;
  *(undefined8 *)(in_RDI + 0x10) = local_20;
  *(undefined8 *)(in_RDI + 0x18) = local_18;
  *(undefined8 *)(in_RDI + 0x20) = local_10;
  v_init<example*>();
  *(undefined8 *)(in_RDI + 0x28) = local_48;
  *(undefined8 *)(in_RDI + 0x30) = local_40;
  *(undefined8 *)(in_RDI + 0x38) = local_38;
  *(undefined8 *)(in_RDI + 0x40) = local_30;
  *(undefined4 *)(in_RDI + 0x70) = 0x3f000000;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0xa0) = 0;
  *(undefined4 *)(in_RDI + 0xa4) = 0;
  *(undefined4 *)(in_RDI + 200) = 1;
  return;
}

Assistant:

memory_tree()
        {
            nodes = v_init<node>();
            examples = v_init<example*>();
            alpha = 0.5;
            routers_used = 0;
            iter = 0;
            num_mistakes = 0;
            test_mode = false;
            max_depth = 0;
            max_ex_in_leaf = 0;
            construct_time = 0;
            test_time = 0;
            top_K = 1;
        }